

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void __thiscall Solver_MCSVM_CS::Solve(Solver_MCSVM_CS *this,double *w)

{
  long lVar1;
  double *pdVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  problem *ppVar7;
  double *pdVar8;
  uint uVar9;
  long lVar10;
  double dVar11;
  uint uVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  void *pvVar16;
  ulong uVar17;
  double *alpha_new;
  void *pvVar18;
  void *pvVar19;
  void *pvVar20;
  void *pvVar21;
  void *pvVar22;
  void *pvVar23;
  void *pvVar24;
  long lVar25;
  long lVar26;
  feature_node *pfVar27;
  int m;
  long lVar28;
  bool bVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  void *pvVar34;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double minG;
  double dVar44;
  double dVar45;
  ulong local_100;
  double local_f8;
  
  uVar36 = this->l;
  local_100 = (ulong)(int)uVar36;
  uVar39 = this->nr_class;
  lVar30 = (long)(int)uVar39;
  uVar14 = uVar39 * uVar36;
  uVar40 = 0;
  uVar38 = 0;
  if (0 < (int)uVar14) {
    uVar38 = (ulong)uVar14;
  }
  uVar32 = 0xffffffffffffffff;
  uVar37 = (long)(int)uVar14 * 4;
  if ((int)uVar14 < 0) {
    uVar37 = uVar32;
  }
  uVar33 = (long)(int)uVar14 << 3;
  if ((int)uVar14 < 0) {
    uVar33 = uVar32;
  }
  pvVar16 = operator_new__(uVar33);
  uVar17 = lVar30 * 4;
  uVar33 = lVar30 * 8;
  if (lVar30 < 0) {
    uVar17 = uVar32;
    uVar33 = uVar32;
  }
  alpha_new = (double *)operator_new__(uVar33);
  uVar32 = local_100 * 4;
  if ((long)local_100 < 0) {
    uVar32 = 0xffffffffffffffff;
  }
  uVar31 = local_100 * 8;
  if ((long)local_100 < 0) {
    uVar31 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar32);
  pvVar19 = operator_new__(uVar31);
  pvVar20 = operator_new__(uVar17);
  pvVar21 = operator_new__(uVar33);
  pvVar22 = operator_new__(uVar37);
  pvVar23 = operator_new__(uVar32);
  pvVar24 = operator_new__(uVar32);
  local_f8 = this->eps * 10.0;
  for (; uVar38 != uVar40; uVar40 = uVar40 + 1) {
    *(undefined8 *)((long)pvVar16 + uVar40 * 8) = 0;
  }
  uVar14 = this->w_size * uVar39;
  uVar40 = 0;
  uVar38 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    uVar38 = uVar40;
  }
  for (; uVar38 != uVar40; uVar40 = uVar40 + 1) {
    w[uVar40] = 0.0;
  }
  if (local_f8 <= 1.0) {
    local_f8 = 1.0;
  }
  ppVar7 = this->prob;
  uVar38 = 0;
  uVar40 = 0;
  if (0 < (int)uVar39) {
    uVar40 = (ulong)uVar39;
  }
  uVar32 = 0;
  pvVar34 = pvVar22;
  if (0 < (int)uVar36) {
    uVar32 = (ulong)uVar36;
  }
  for (; uVar38 != uVar32; uVar38 = uVar38 + 1) {
    for (uVar37 = 0; uVar40 != uVar37; uVar37 = uVar37 + 1) {
      *(int *)((long)pvVar34 + uVar37 * 4) = (int)uVar37;
    }
    pfVar27 = ppVar7->x[uVar38];
    *(undefined8 *)((long)pvVar19 + uVar38 * 8) = 0;
    dVar41 = 0.0;
    for (; pfVar27->index != -1; pfVar27 = pfVar27 + 1) {
      dVar41 = dVar41 + pfVar27->value * pfVar27->value;
      *(double *)((long)pvVar19 + uVar38 * 8) = dVar41;
    }
    *(uint *)((long)pvVar24 + uVar38 * 4) = uVar39;
    *(int *)((long)pvVar23 + uVar38 * 4) = (int)ppVar7->y[uVar38];
    *(int *)((long)pvVar18 + uVar38 * 4) = (int)uVar38;
    pvVar34 = (void *)((long)pvVar34 + lVar30 * 4);
  }
  uVar36 = 0;
  bVar13 = true;
  while (bVar29 = bVar13, (int)uVar36 < this->max_iter) {
    uVar38 = 0;
    if (0 < (int)local_100) {
      uVar38 = local_100 & 0xffffffff;
    }
    uVar40 = local_100 & 0xffffffff;
    for (uVar32 = 0; uVar38 != uVar32; uVar32 = uVar32 + 1) {
      iVar15 = rand();
      lVar30 = (long)(iVar15 % (int)uVar40) + uVar32;
      uVar3 = *(undefined4 *)((long)pvVar18 + uVar32 * 4);
      *(undefined4 *)((long)pvVar18 + uVar32 * 4) = *(undefined4 *)((long)pvVar18 + lVar30 * 4);
      *(undefined4 *)((long)pvVar18 + lVar30 * 4) = uVar3;
      uVar40 = (ulong)((int)uVar40 - 1);
    }
    dVar41 = -INFINITY;
    for (iVar15 = 0; iVar15 < (int)local_100; iVar15 = iVar15 + 1) {
      iVar4 = *(int *)((long)pvVar18 + (long)iVar15 * 4);
      lVar30 = (long)iVar4;
      dVar43 = *(double *)((long)pvVar19 + lVar30 * 8);
      dVar45 = dVar41;
      if (0.0 < dVar43) {
        iVar35 = this->nr_class;
        lVar25 = (long)(iVar35 * iVar4);
        uVar39 = *(uint *)((long)pvVar24 + lVar30 * 4);
        uVar40 = (ulong)uVar39;
        pdVar8 = this->G;
        uVar38 = 0;
        if (0 < (int)uVar39) {
          uVar38 = (ulong)uVar39;
        }
        for (uVar32 = 0; uVar38 != uVar32; uVar32 = uVar32 + 1) {
          pdVar8[uVar32] = 1.0;
        }
        uVar14 = *(uint *)((long)pvVar23 + lVar30 * 4);
        if ((int)uVar14 < (int)uVar39) {
          this->G[(int)uVar14] = 0.0;
        }
        ppVar7 = this->prob;
        for (pfVar27 = ppVar7->x[lVar30]; iVar5 = pfVar27->index, iVar5 != -1; pfVar27 = pfVar27 + 1
            ) {
          pdVar8 = this->G;
          for (uVar32 = 0; uVar38 != uVar32; uVar32 = uVar32 + 1) {
            pdVar8[uVar32] =
                 w[(long)((iVar5 + -1) * iVar35) +
                   (long)*(int *)((long)pvVar22 + uVar32 * 4 + lVar25 * 4)] * pfVar27->value +
                 pdVar8[uVar32];
          }
        }
        pdVar8 = this->G;
        minG = INFINITY;
        dVar44 = -INFINITY;
        for (uVar32 = 0; uVar38 != uVar32; uVar32 = uVar32 + 1) {
          dVar42 = pdVar8[uVar32];
          dVar11 = dVar42;
          if (minG <= dVar42 ||
              0.0 <= *(double *)
                      ((long)pvVar16 +
                      (long)*(int *)((long)pvVar22 + uVar32 * 4 + lVar25 * 4) * 8 + lVar25 * 8)) {
            dVar11 = minG;
          }
          minG = dVar11;
          if (dVar42 <= dVar44) {
            dVar42 = dVar44;
          }
          dVar44 = dVar42;
        }
        if ((((int)uVar14 < (int)uVar39) &&
            (pdVar2 = (double *)((long)pvVar16 + (long)(int)ppVar7->y[lVar30] * 8 + lVar25 * 8),
            *pdVar2 <= this->C[(int)ppVar7->y[lVar30]] && this->C[(int)ppVar7->y[lVar30]] != *pdVar2
            )) && (pdVar8[(int)uVar14] < minG)) {
          minG = pdVar8[(int)uVar14];
        }
        uVar38 = 0;
        while( true ) {
          iVar35 = (int)uVar40;
          lVar28 = (long)iVar35;
          if (lVar28 <= (long)uVar38) break;
          iVar5 = *(int *)((long)pvVar22 + uVar38 * 4 + lVar25 * 4);
          bVar13 = be_shrunk(this,iVar4,(uint)uVar38,uVar14,
                             *(double *)((long)pvVar16 + (long)iVar5 * 8 + lVar25 * 8),minG);
          if (bVar13) {
            lVar10 = lVar28 * 4 + lVar25 * 4;
            lVar1 = 0;
            do {
              lVar26 = lVar1;
              m = (iVar35 - 1U) + (int)lVar26;
              *(int *)((long)pvVar24 + lVar30 * 4) = m;
              if (lVar28 + -1 + lVar26 <= (long)uVar38) {
                uVar40 = (ulong)((iVar35 + (int)lVar26) - 1);
                goto LAB_00104a25;
              }
              iVar6 = *(int *)((long)pvVar22 + lVar26 * 4 + lVar10 + -4);
              bVar13 = be_shrunk(this,iVar4,m,uVar14,
                                 *(double *)((long)pvVar16 + (long)iVar6 * 8 + lVar25 * 8),minG);
              lVar1 = lVar26 + -1;
              uVar39 = (int)uVar40 - 1;
              uVar40 = (ulong)uVar39;
            } while (bVar13);
            *(int *)((long)pvVar22 + uVar38 * 4 + lVar25 * 4) = iVar6;
            *(int *)((long)pvVar22 + lVar1 * 4 + lVar10) = iVar5;
            dVar42 = pdVar8[uVar38];
            pdVar8[uVar38] = pdVar8[lVar28 + lVar1];
            pdVar8[lVar28 + lVar1] = dVar42;
            uVar12 = (uint)uVar38;
            uVar9 = uVar14;
            if ((uVar14 == uVar39) || (uVar12 = uVar39, uVar9 = uVar39, uVar38 == uVar14)) {
              uVar14 = uVar12;
              uVar40 = (ulong)uVar9;
              *(uint *)((long)pvVar23 + lVar30 * 4) = uVar14;
            }
            else {
              uVar40 = (ulong)(iVar35 - 1U) + lVar26;
            }
          }
LAB_00104a25:
          uVar38 = uVar38 + 1;
        }
        if (iVar35 < 2) {
          lVar30 = (long)(int)local_100;
          local_100 = (ulong)((int)local_100 - 1);
          *(undefined4 *)((long)pvVar18 + (long)iVar15 * 4) =
               *(undefined4 *)((long)pvVar18 + lVar30 * 4 + -4);
          *(int *)((long)pvVar18 + lVar30 * 4 + -4) = iVar4;
          iVar15 = iVar15 + -1;
        }
        else {
          dVar44 = dVar44 - minG;
          if (1e-12 < dVar44) {
            pdVar8 = this->B;
            pdVar2 = this->G;
            for (uVar38 = 0; (uVar40 & 0xffffffff) != uVar38; uVar38 = uVar38 + 1) {
              pdVar8[uVar38] =
                   *(double *)
                    ((long)pvVar16 +
                    (long)*(int *)((long)pvVar22 + uVar38 * 4 + lVar25 * 4) * 8 + lVar25 * 8) *
                   -dVar43 + pdVar2[uVar38];
            }
            solve_sub_problem(this,dVar43,uVar14,this->C[(int)ppVar7->y[lVar30]],iVar35,alpha_new);
            uVar32 = 0;
            uVar38 = uVar40 & 0xffffffff;
            if (iVar35 < 1) {
              uVar38 = uVar32;
            }
            uVar39 = 0;
            for (; uVar38 != uVar32; uVar32 = uVar32 + 1) {
              iVar4 = *(int *)((long)pvVar22 + uVar32 * 4 + lVar25 * 4);
              dVar43 = alpha_new[uVar32] - *(double *)((long)pvVar16 + (long)iVar4 * 8 + lVar25 * 8)
              ;
              *(double *)((long)pvVar16 + (long)iVar4 * 8 + lVar25 * 8) = alpha_new[uVar32];
              if (1e-12 <= ABS(dVar43)) {
                *(int *)((long)pvVar20 + (long)(int)uVar39 * 4) = iVar4;
                *(double *)((long)pvVar21 + (long)(int)uVar39 * 8) = dVar43;
                uVar39 = uVar39 + 1;
              }
            }
            pfVar27 = this->prob->x[lVar30];
            iVar4 = this->nr_class;
            uVar38 = (ulong)uVar39;
            if ((int)uVar39 < 1) {
              uVar38 = 0;
            }
            for (; (long)pfVar27->index != -1; pfVar27 = pfVar27 + 1) {
              lVar30 = ((long)pfVar27->index + -1) * (long)iVar4;
              for (uVar40 = 0; uVar38 != uVar40; uVar40 = uVar40 + 1) {
                lVar25 = (long)*(int *)((long)pvVar20 + uVar40 * 4);
                w[lVar30 + lVar25] =
                     *(double *)((long)pvVar21 + uVar40 * 8) * pfVar27->value + w[lVar30 + lVar25];
              }
            }
            dVar45 = dVar44;
            if (dVar44 <= dVar41) {
              dVar45 = dVar41;
            }
          }
        }
      }
      dVar41 = dVar45;
    }
    uVar36 = uVar36 + 1;
    if (uVar36 % 10 == 0) {
      info(".");
    }
    bVar13 = dVar41 < local_f8;
    if (dVar41 < local_f8) {
      if ((bool)(bVar29 & dVar41 < this->eps)) break;
      uVar39 = this->l;
      local_100 = (ulong)uVar39;
      iVar15 = this->nr_class;
      uVar38 = 0;
      if (0 < (int)uVar39) {
        uVar38 = (ulong)uVar39;
      }
      for (uVar40 = 0; uVar38 != uVar40; uVar40 = uVar40 + 1) {
        *(int *)((long)pvVar24 + uVar40 * 4) = iVar15;
      }
      info("*");
      local_f8 = local_f8 * 0.5;
      if (local_f8 <= this->eps) {
        local_f8 = this->eps;
      }
    }
  }
  uVar38 = 0;
  info("\noptimization finished, #iter = %d\n");
  if (this->max_iter <= (int)uVar36) {
    info("\nWARNING: reaching max number of iterations\n");
  }
  iVar15 = this->nr_class;
  uVar36 = this->w_size * iVar15;
  uVar40 = (ulong)uVar36;
  if ((int)uVar36 < 1) {
    uVar40 = uVar38;
  }
  dVar41 = 0.0;
  for (; uVar40 != uVar38; uVar38 = uVar38 + 1) {
    dVar41 = dVar41 + w[uVar38] * w[uVar38];
  }
  dVar41 = dVar41 * 0.5;
  uVar36 = this->l;
  uVar40 = 0;
  uVar38 = (ulong)(uVar36 * iVar15);
  if ((int)(uVar36 * iVar15) < 1) {
    uVar38 = uVar40;
  }
  uVar39 = 0;
  for (; uVar38 != uVar40; uVar40 = uVar40 + 1) {
    dVar43 = *(double *)((long)pvVar16 + uVar40 * 8);
    dVar41 = dVar41 + dVar43;
    uVar39 = uVar39 + (dVar43 != 0.0);
  }
  uVar40 = 0;
  uVar38 = (ulong)uVar36;
  if ((int)uVar36 < 1) {
    uVar38 = uVar40;
  }
  pvVar34 = pvVar16;
  for (; uVar38 != uVar40; uVar40 = uVar40 + 1) {
    dVar41 = dVar41 - *(double *)((long)pvVar34 + (long)(int)this->prob->y[uVar40] * 8);
    pvVar34 = (void *)((long)pvVar34 + (long)iVar15 * 8);
  }
  info("Objective value = %lf\n",dVar41);
  info("nSV = %d\n",(ulong)uVar39);
  operator_delete__(pvVar16);
  operator_delete__(alpha_new);
  operator_delete__(pvVar18);
  operator_delete__(pvVar19);
  operator_delete__(pvVar20);
  operator_delete__(pvVar21);
  operator_delete__(pvVar22);
  operator_delete__(pvVar23);
  operator_delete__(pvVar24);
  return;
}

Assistant:

void Solver_MCSVM_CS::Solve(double *w)
{
	int i, m, s;
	int iter = 0;
	double *alpha =  new double[l*nr_class];
	double *alpha_new = new double[nr_class];
	int *index = new int[l];
	double *QD = new double[l];
	int *d_ind = new int[nr_class];
	double *d_val = new double[nr_class];
	int *alpha_index = new int[nr_class*l];
	int *y_index = new int[l];
	int active_size = l;
	int *active_size_i = new int[l];
	double eps_shrink = max(10.0*eps, 1.0); // stopping tolerance for shrinking
	bool start_from_all = true;

	// Initial alpha can be set here. Note that 
	// sum_m alpha[i*nr_class+m] = 0, for all i=1,...,l-1
	// alpha[i*nr_class+m] <= C[GETI(i)] if prob->y[i] == m
	// alpha[i*nr_class+m] <= 0 if prob->y[i] != m
	// If initial alpha isn't zero, uncomment the for loop below to initialize w
	for(i=0;i<l*nr_class;i++)
		alpha[i] = 0;

	for(i=0;i<w_size*nr_class;i++)
		w[i] = 0;
	for(i=0;i<l;i++)
	{
		for(m=0;m<nr_class;m++)
			alpha_index[i*nr_class+m] = m;
		feature_node *xi = prob->x[i];
		QD[i] = 0;
		while(xi->index != -1)
		{
			double val = xi->value;
			QD[i] += val*val;

			// Uncomment the for loop if initial alpha isn't zero
			// for(m=0; m<nr_class; m++)
			//	w[(xi->index-1)*nr_class+m] += alpha[i*nr_class+m]*val;
			xi++;
		}
		active_size_i[i] = nr_class;
		y_index[i] = (int)prob->y[i];
		index[i] = i;
	}

	while(iter < max_iter)
	{
		double stopping = -INF;
		for(i=0;i<active_size;i++)
		{
			int j = i+rand()%(active_size-i);
			swap(index[i], index[j]);
		}
		for(s=0;s<active_size;s++)
		{
			i = index[s];
			double Ai = QD[i];
			double *alpha_i = &alpha[i*nr_class];
			int *alpha_index_i = &alpha_index[i*nr_class];

			if(Ai > 0)
			{
				for(m=0;m<active_size_i[i];m++)
					G[m] = 1;
				if(y_index[i] < active_size_i[i])
					G[y_index[i]] = 0;

				feature_node *xi = prob->x[i];
				while(xi->index!= -1)
				{
					double *w_i = &w[(xi->index-1)*nr_class];
					for(m=0;m<active_size_i[i];m++)
						G[m] += w_i[alpha_index_i[m]]*(xi->value);
					xi++;
				}

				double minG = INF;
				double maxG = -INF;
				for(m=0;m<active_size_i[i];m++)
				{
					if(alpha_i[alpha_index_i[m]] < 0 && G[m] < minG)
						minG = G[m];
					if(G[m] > maxG)
						maxG = G[m];
				}
				if(y_index[i] < active_size_i[i])
					if(alpha_i[(int) prob->y[i]] < C[GETI(i)] && G[y_index[i]] < minG)
						minG = G[y_index[i]];

				for(m=0;m<active_size_i[i];m++)
				{
					if(be_shrunk(i, m, y_index[i], alpha_i[alpha_index_i[m]], minG))
					{
						active_size_i[i]--;
						while(active_size_i[i]>m)
						{
							if(!be_shrunk(i, active_size_i[i], y_index[i],
											alpha_i[alpha_index_i[active_size_i[i]]], minG))
							{
								swap(alpha_index_i[m], alpha_index_i[active_size_i[i]]);
								swap(G[m], G[active_size_i[i]]);
								if(y_index[i] == active_size_i[i])
									y_index[i] = m;
								else if(y_index[i] == m)
									y_index[i] = active_size_i[i];
								break;
							}
							active_size_i[i]--;
						}
					}
				}

				if(active_size_i[i] <= 1)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}

				if(maxG-minG <= 1e-12)
					continue;
				else
					stopping = max(maxG - minG, stopping);

				for(m=0;m<active_size_i[i];m++)
					B[m] = G[m] - Ai*alpha_i[alpha_index_i[m]] ;

				solve_sub_problem(Ai, y_index[i], C[GETI(i)], active_size_i[i], alpha_new);
				int nz_d = 0;
				for(m=0;m<active_size_i[i];m++)
				{
					double d = alpha_new[m] - alpha_i[alpha_index_i[m]];
					alpha_i[alpha_index_i[m]] = alpha_new[m];
					if(fabs(d) >= 1e-12)
					{
						d_ind[nz_d] = alpha_index_i[m];
						d_val[nz_d] = d;
						nz_d++;
					}
				}

				xi = prob->x[i];
				while(xi->index != -1)
				{
					double *w_i = &w[(xi->index-1)*nr_class];
					for(m=0;m<nz_d;m++)
						w_i[d_ind[m]] += d_val[m]*xi->value;
					xi++;
				}
			}
		}

		iter++;
		if(iter % 10 == 0)
		{
			info(".");
		}

		if(stopping < eps_shrink)
		{
			if(stopping < eps && start_from_all == true)
				break;
			else
			{
				active_size = l;
				for(i=0;i<l;i++)
					active_size_i[i] = nr_class;
				info("*");
				eps_shrink = max(eps_shrink/2, eps);
				start_from_all = true;
			}
		}
		else
			start_from_all = false;
	}

	info("\noptimization finished, #iter = %d\n",iter);
	if (iter >= max_iter)
		info("\nWARNING: reaching max number of iterations\n");

	// calculate objective value
	double v = 0;
	int nSV = 0;
	for(i=0;i<w_size*nr_class;i++)
		v += w[i]*w[i];
	v = 0.5*v;
	for(i=0;i<l*nr_class;i++)
	{
		v += alpha[i];
		if(fabs(alpha[i]) > 0)
			nSV++;
	}
	for(i=0;i<l;i++)
		v -= alpha[i*nr_class+(int)prob->y[i]];
	info("Objective value = %lf\n",v);
	info("nSV = %d\n",nSV);

	delete [] alpha;
	delete [] alpha_new;
	delete [] index;
	delete [] QD;
	delete [] d_ind;
	delete [] d_val;
	delete [] alpha_index;
	delete [] y_index;
	delete [] active_size_i;
}